

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O1

int Ssc_ManCheckEquivalence(Ssc_Man_t *p,int iRepr,int iNode,int fCompl)

{
  int iVar1;
  sat_solver *s;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  abctime *paVar6;
  int pLitsSat [2];
  timespec ts;
  uint local_38;
  uint local_34;
  timespec local_30;
  
  if (iRepr == iNode) {
    __assert_fail("iRepr != iNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                  ,0x160,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
  }
  if (iNode < iRepr) {
    return 0;
  }
  if (iNode <= iRepr) {
    __assert_fail("iRepr < iNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                  ,0x163,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
  }
  if (iRepr != 0) {
    Ssc_ManCnfNodeAddToSolver(p,iRepr);
  }
  Ssc_ManCnfNodeAddToSolver(p,iNode);
  s = p->pSat;
  if ((s->qtail != s->qhead) && (iVar3 = sat_solver_simplify(s), iVar3 == 0)) {
    __assert_fail("RetValue != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                  ,0xe1,"void sat_solver_compress(sat_solver *)");
  }
  if (iRepr < 0) {
LAB_00596206:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar3 = p->vId2Var->nSize;
  if (iVar3 <= iRepr) goto LAB_00596206;
  piVar2 = p->vId2Var->pArray;
  iVar1 = piVar2[(uint)iRepr];
  if (iVar1 < 0) {
LAB_00596244:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  local_38 = iVar1 * 2;
  if ((iNode < 0) || (iVar3 <= iNode)) goto LAB_00596206;
  if ((1 < (uint)fCompl) || (iVar3 = piVar2[(uint)iNode], iVar3 < 0)) goto LAB_00596244;
  local_34 = ((uint)(iRepr != 0) ^ fCompl) + iVar3 * 2;
  iVar3 = clock_gettime(3,&local_30);
  if (iVar3 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  iVar3 = sat_solver_solve(p->pSat,(lit *)&local_38,(lit *)&local_30,(long)p->pPars->nBTLimit,0,0,0)
  ;
  if (iVar3 == 1) {
LAB_0059612d:
    Ssc_ManCollectSatPattern(p,p->vPattern);
    iVar3 = clock_gettime(3,&local_30);
    if (iVar3 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    lVar5 = lVar5 + lVar4;
    paVar6 = &p->timeSatSat;
    iVar3 = 1;
  }
  else {
    if (iVar3 == -1) {
      if (((int)local_38 < 0) || (local_38 = local_38 ^ 1, (int)local_34 < 0)) {
LAB_00596282:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10e,"int Abc_LitNot(int)");
      }
      local_34 = local_34 ^ 1;
      iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_38,(lit *)&local_30);
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                      ,0x17a,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
      }
      iVar3 = clock_gettime(3,&local_30);
      if (iVar3 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
      }
      p->timeSatUnsat = p->timeSatUnsat + lVar5 + lVar4;
      if (iRepr == 0) {
        return -1;
      }
      iVar3 = clock_gettime(3,&local_30);
      if (iVar3 < 0) {
        lVar4 = 1;
      }
      else {
        lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
        lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_30.tv_sec * -1000000;
      }
      iVar3 = sat_solver_solve(p->pSat,(lit *)&local_38,(lit *)&local_30,(long)p->pPars->nBTLimit,0,
                               0,0);
      if (iVar3 == 1) goto LAB_0059612d;
      if (iVar3 == -1) {
        if (((int)local_38 < 0) || (local_38 = local_38 ^ 1, (int)local_34 < 0)) goto LAB_00596282;
        local_34 = local_34 ^ 1;
        iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_38,(lit *)&local_30);
        if (iVar3 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                        ,0x196,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
        }
        iVar3 = clock_gettime(3,&local_30);
        if (iVar3 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
        }
        paVar6 = &p->timeSatUnsat;
        lVar5 = lVar5 + lVar4;
        iVar3 = -1;
        goto LAB_005961e0;
      }
    }
    iVar3 = clock_gettime(3,&local_30);
    if (iVar3 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    lVar5 = lVar5 + lVar4;
    paVar6 = &p->timeSatUndec;
    iVar3 = 0;
  }
LAB_005961e0:
  *paVar6 = *paVar6 + lVar5;
  return iVar3;
}

Assistant:

int Ssc_ManCheckEquivalence( Ssc_Man_t * p, int iRepr, int iNode, int fCompl )
{
    int pLitsSat[2], RetValue;
    abctime clk;
    assert( iRepr != iNode );
    if ( iRepr > iNode )
        return l_Undef;
    assert( iRepr < iNode );
//    if ( p->nTimeOut )
//        sat_solver_set_runtime_limit( p->pSat, p->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );

    // create CNF
    if ( iRepr )
    Ssc_ManCnfNodeAddToSolver( p, iRepr );
    Ssc_ManCnfNodeAddToSolver( p, iNode );
    sat_solver_compress( p->pSat );

    // order the literals
    pLitsSat[0] = Abc_Var2Lit( Ssc_ObjSatVar(p, iRepr), 0 );
    pLitsSat[1] = Abc_Var2Lit( Ssc_ObjSatVar(p, iNode), fCompl ^ (int)(iRepr > 0) );

    // solve under assumptions
    // A = 1; B = 0
    clk = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, pLitsSat, pLitsSat + 2, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_False )
    {
        pLitsSat[0] = Abc_LitNot( pLitsSat[0] ); // compl
        pLitsSat[1] = Abc_LitNot( pLitsSat[1] ); // compl
        RetValue = sat_solver_addclause( p->pSat, pLitsSat, pLitsSat + 2 );
        assert( RetValue );
        p->timeSatUnsat += Abc_Clock() - clk;
    }
    else if ( RetValue == l_True )
    {
        Ssc_ManCollectSatPattern( p, p->vPattern );
        p->timeSatSat += Abc_Clock() - clk;
        return l_True;
    }
    else // if ( RetValue1 == l_Undef )
    {
        p->timeSatUndec += Abc_Clock() - clk;
        return l_Undef;
    }

    // if the old node was constant 0, we already know the answer
    if ( iRepr == 0 )
        return l_False;

    // solve under assumptions
    // A = 0; B = 1
    clk = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, pLitsSat, pLitsSat + 2, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_False )
    {
        pLitsSat[0] = Abc_LitNot( pLitsSat[0] );
        pLitsSat[1] = Abc_LitNot( pLitsSat[1] );
        RetValue = sat_solver_addclause( p->pSat, pLitsSat, pLitsSat + 2 );
        assert( RetValue );
        p->timeSatUnsat += Abc_Clock() - clk;
    }
    else if ( RetValue == l_True )
    {
        Ssc_ManCollectSatPattern( p, p->vPattern );
        p->timeSatSat += Abc_Clock() - clk;
        return l_True;
    }
    else // if ( RetValue1 == l_Undef )
    {
        p->timeSatUndec += Abc_Clock() - clk;
        return l_Undef;
    }
    return l_False;
}